

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBodyEasy.h
# Opt level: O2

void __thiscall chrono::ChBodyEasyEllipsoid::~ChBodyEasyEllipsoid(ChBodyEasyEllipsoid *this)

{
  ~ChBodyEasyEllipsoid
            ((ChBodyEasyEllipsoid *)
             &this[-1].super_ChBody.forcelist.
              super__Vector_base<std::shared_ptr<chrono::ChForce>,_std::allocator<std::shared_ptr<chrono::ChForce>_>_>
              ._M_impl.super__Vector_impl_data._M_finish);
  return;
}

Assistant:

class ChApi ChBodyEasyEllipsoid : public ChBody {
  public:
    /// Create a ChBody with optional ellipsoid visualization and/or collision shape. The ellipsoid is created centered
    /// at the center of mass. Mass and inertia are set automatically depending on density.
    ChBodyEasyEllipsoid(ChVector<> radius,                                      ///< radii of the ellipsoid
                        double density,                                         ///< density of the body
                        bool visualize = true,                                  ///< create visualization asset
                        bool collide = false,                                   ///< enable collision
                        std::shared_ptr<ChMaterialSurface> material = nullptr,  ///< surface contact material
                        std::shared_ptr<collision::ChCollisionModel> collision_model =
                            chrono_types::make_shared<collision::ChCollisionModelBullet>()  ///< collision model
    );

    /// Create a ChBody with an ellipsoid visualization and collision shape using the specified collision model type.
    /// The ellipsoid is created centered at the center of mass. Mass and inertia are set automatically depending on
    /// density.
    ChBodyEasyEllipsoid(ChVector<> radius,                               ///< radii of the ellipsoid
                        double density,                                  ///< density of the body
                        std::shared_ptr<ChMaterialSurface> material,     ///< surface contact material
                        collision::ChCollisionSystemType collision_type  ///< collision model type
    );

  private:
    void SetupBody(ChVector<> radius,
                   double density,
                   bool visualize,
                   bool collide,
                   std::shared_ptr<ChMaterialSurface> material);
}